

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O0

void __thiscall FTextureManager::AddGroup(FTextureManager *this,int wadnum,int ns,int usetype)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  FString local_30;
  FString Name;
  int local_20;
  int lasttx;
  int firsttx;
  int usetype_local;
  int ns_local;
  int wadnum_local;
  FTextureManager *this_local;
  
  local_20 = FWadCollection::GetFirstLump(&Wads,wadnum);
  Name.Chars._4_4_ = FWadCollection::GetLastLump(&Wads,wadnum);
  FString::FString(&local_30);
  for (; local_20 <= Name.Chars._4_4_; local_20 = local_20 + 1) {
    iVar1 = FWadCollection::GetLumpNamespace(&Wads,local_20);
    if (iVar1 == ns) {
      FWadCollection::GetLumpName(&Wads,&local_30,local_20);
      pcVar3 = FString::operator_cast_to_char_(&local_30);
      iVar1 = FWadCollection::CheckNumForName(&Wads,pcVar3,ns);
      if (iVar1 == local_20) {
        CreateTexture(this,local_20,usetype);
      }
      (*StartScreen->_vptr_FStartupScreen[2])();
    }
    else if ((ns == 2) && (uVar2 = FWadCollection::GetLumpFlags(&Wads,local_20), (uVar2 & 1) != 0))
    {
      pcVar3 = FString::operator_cast_to_char_(&local_30);
      iVar1 = FWadCollection::CheckNumForName(&Wads,pcVar3,2);
      if (iVar1 < local_20) {
        CreateTexture(this,local_20,usetype);
      }
      (*StartScreen->_vptr_FStartupScreen[2])();
    }
  }
  FString::~FString(&local_30);
  return;
}

Assistant:

void FTextureManager::AddGroup(int wadnum, int ns, int usetype)
{
	int firsttx = Wads.GetFirstLump(wadnum);
	int lasttx = Wads.GetLastLump(wadnum);
	FString Name;

	// Go from first to last so that ANIMDEFS work as expected. However,
	// to avoid duplicates (and to keep earlier entries from overriding
	// later ones), the texture is only inserted if it is the one returned
	// by doing a check by name in the list of wads.

	for (; firsttx <= lasttx; ++firsttx)
	{
		if (Wads.GetLumpNamespace(firsttx) == ns)
		{
			Wads.GetLumpName (Name, firsttx);

			if (Wads.CheckNumForName (Name, ns) == firsttx)
			{
				CreateTexture (firsttx, usetype);
			}
			StartScreen->Progress();
		}
		else if (ns == ns_flats && Wads.GetLumpFlags(firsttx) & LUMPF_MAYBEFLAT)
		{
			if (Wads.CheckNumForName (Name, ns) < firsttx)
			{
				CreateTexture (firsttx, usetype);
			}
			StartScreen->Progress();
		}
	}
}